

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

void nni_http_set_host(nng_http *conn,char *host)

{
  char *__s;
  
  __s = conn->host;
  if (__s != host) {
    snprintf(__s,0x104,"%s",host);
  }
  nni_list_node_remove(&(conn->host_header).node);
  (conn->host_header).name = "Host";
  (conn->host_header).value = __s;
  (conn->host_header).field_0x20 = (conn->host_header).field_0x20 & 0xf8 | 3;
  nni_list_prepend(&(conn->req).data.hdrs,&conn->host_header);
  return;
}

Assistant:

void
nni_http_set_host(nng_http *conn, const char *host)
{
	if (host != conn->host) {
		snprintf(conn->host, sizeof(conn->host), "%s", host);
	}
	nni_list_node_remove(&conn->host_header.node);
	conn->host_header.name         = "Host";
	conn->host_header.value        = conn->host;
	conn->host_header.static_name  = true;
	conn->host_header.static_value = true;
	conn->host_header.alloc_header = false;
	nni_list_prepend(&conn->req.data.hdrs, &conn->host_header);
}